

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O3

void __thiscall
QNetworkReplyImplPrivate::error
          (QNetworkReplyImplPrivate *this,NetworkError code,QString *errorMessage)

{
  QNetworkReply *this_00;
  
  if ((this->super_QNetworkReplyPrivate).errorCode == NoError) {
    this_00 = *(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8;
    (this->super_QNetworkReplyPrivate).errorCode = code;
    QIODevice::setErrorString((QString *)this_00);
    QNetworkReply::errorOccurred(this_00,code);
    return;
  }
  error();
  return;
}

Assistant:

void QNetworkReplyImplPrivate::error(QNetworkReplyImpl::NetworkError code, const QString &errorMessage)
{
    Q_Q(QNetworkReplyImpl);
    // Can't set and emit multiple errors.
    if (errorCode != QNetworkReply::NoError) {
        qWarning( "QNetworkReplyImplPrivate::error: Internal problem, this method must only be called once.");
        return;
    }

    errorCode = code;
    q->setErrorString(errorMessage);

    // note: might not be a good idea, since users could decide to delete us
    // which would delete the backend too...
    // maybe we should protect the backend
    emit q->errorOccurred(code);
}